

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

void __thiscall CoreML::Model::Model(Model *this,string *description)

{
  ModelDescription *this_00;
  Metadata *this_01;
  
  Model(this);
  this_00 = Specification::Model::mutable_description
                      ((this->m_spec).
                       super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
  this_01 = Specification::ModelDescription::mutable_metadata(this_00);
  Specification::Metadata::set_shortdescription(this_01,description);
  return;
}

Assistant:

Model::Model(const std::string& description)
    : Model::Model() {
        Specification::Metadata* metadata = m_spec->mutable_description()->mutable_metadata();
        metadata->set_shortdescription(description);
    }